

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_annotations.cc
# Opt level: O0

double ValgrindSlowdown(void)

{
  double dVar1;
  int iVar2;
  char *__nptr;
  char *local_28;
  char *env;
  double local_slowdown;
  
  dVar1 = ValgrindSlowdown::slowdown;
  env = (char *)ValgrindSlowdown::slowdown;
  iVar2 = RunningOnValgrind();
  if (iVar2 == 0) {
    local_slowdown = 1.0;
  }
  else {
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      __nptr = getenv("VALGRIND_SLOWDOWN");
      if (__nptr == (char *)0x0) {
        local_28 = (char *)0x4049000000000000;
      }
      else {
        local_28 = (char *)atof(__nptr);
      }
      env = local_28;
      ValgrindSlowdown::slowdown = (double)local_28;
    }
    local_slowdown = (double)env;
  }
  return local_slowdown;
}

Assistant:

double ValgrindSlowdown(void) {
  /* Same initialization hack as in RunningOnValgrind(). */
  static volatile double slowdown = 0.0;
  double local_slowdown = slowdown;
  ANNOTATE_BENIGN_RACE(&slowdown, "safe hack");
  if (RunningOnValgrind() == 0) {
    return 1.0;
  }
  if (local_slowdown == 0.0) {
    char *env = getenv("VALGRIND_SLOWDOWN");
    slowdown = local_slowdown = env ? atof(env) : 50.0;
  }
  return local_slowdown;
}